

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O1

int Fl::screen_num(int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  if (num_screens < 0) {
    screen_init();
  }
  if (num_screens < 1) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    uVar7 = 0;
    do {
      if (num_screens < 0) {
        screen_init();
      }
      if (num_screens < 1) {
        iVar5 = 0;
        iVar2 = 0;
        iVar6 = 0;
        iVar3 = 0;
      }
      else {
        uVar4 = 0;
        if (uVar8 < (uint)num_screens) {
          uVar4 = (ulong)uVar8;
        }
        iVar5 = (int)screens[uVar4].x_org;
        iVar2 = (int)screens[uVar4].y_org;
        iVar6 = (int)screens[uVar4].width;
        iVar3 = (int)screens[uVar4].height;
      }
      bVar1 = y < iVar3 + iVar2;
      if (bVar1 && ((iVar2 <= y && iVar5 <= x) && x < iVar6 + iVar5)) {
        uVar7 = uVar8;
      }
    } while ((!bVar1 || ((iVar2 > y || iVar5 > x) || iVar6 + iVar5 <= x)) &&
            (uVar8 = uVar8 + 1, (int)uVar8 < num_screens));
  }
  return uVar7;
}

Assistant:

int Fl::screen_num(int x, int y) {
  int screen = 0;
  if (num_screens < 0) screen_init();
  
  for (int i = 0; i < num_screens; i ++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    if ((x >= sx) && (x < (sx+sw)) && (y >= sy) && (y < (sy+sh))) {
      screen = i;
      break;
    }
  }
  return screen;
}